

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O0

bool __thiscall miniros::TransportTCP::setNonBlocking(TransportTCP *this)

{
  string *in_RDI;
  bool enabled;
  int result;
  socket_fd_t *in_stack_ffffffffffffff78;
  Level level;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  LogLocation *in_stack_ffffffffffffff90;
  Level level_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_38 [36];
  int local_14;
  
  if (((undefined1  [16])in_RDI[0x11].field_2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_14 = set_non_blocking(in_stack_ffffffffffffff78);
    level = (Level)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if (local_14 != 0) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((setNonBlocking::loc.initialized_ ^ 0xffU) & 1) != 0) {
        level_00 = (Level)((ulong)&stack0xffffffffffffffc7 >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   (allocator<char> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
        ;
        console::initializeLogLocation
                  ((LogLocation *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_RDI,level_00);
        std::__cxx11::string::~string(local_38);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
      }
      if (setNonBlocking::loc.level_ != Error) {
        console::setLogLocationLevel
                  ((LogLocation *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   level);
        console::checkLogLocationEnabled(in_stack_ffffffffffffff90);
      }
      if ((setNonBlocking::loc.logger_enabled_ & 1U) != 0) {
        console::print((FilterBase *)0x0,setNonBlocking::loc.logger_,
                       (Level)(ulong)setNonBlocking::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0x56,"bool miniros::TransportTCP::setNonBlocking()",
                       "setting socket [%d] as non_blocking failed with error [%d]",
                       *(undefined4 *)((long)&in_RDI[4].field_2 + 8),local_14);
      }
      (**(code **)(*(long *)in_RDI + 0x40))();
      return false;
    }
  }
  return true;
}

Assistant:

bool TransportTCP::setNonBlocking()
{
  if (!(flags_ & SYNCHRONOUS))
  {
	  int result = set_non_blocking(sock_);
	  if ( result != 0 ) {
	      MINIROS_ERROR("setting socket [%d] as non_blocking failed with error [%d]", sock_, result);
      close();
      return false;
    }
  }

  return true;
}